

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Term(DataParser *parser)

{
  bool bVar1;
  char cVar2;
  bool looping;
  DataParser *parser_local;
  
  Factor(parser);
  bVar1 = true;
  while (bVar1) {
    cVar2 = DataParser::Look(parser);
    if (cVar2 == '*') {
      Multiply(parser);
    }
    else if (cVar2 == '/') {
      Divide(parser);
    }
    else {
      bVar1 = false;
    }
  }
  return;
}

Assistant:

static void Term(DataParser& parser)
	{
		Factor(parser);

		bool looping = true;
		while (looping)
		{
			switch (parser.Look())
			{
			case '*': Multiply(parser); break;
			case '/': Divide(parser); break;
			default: looping = false;
			}
		}
	}